

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O3

void __thiscall
AMorphedMonster::Die(AMorphedMonster *this,AActor *source,AActor *inflictor,int dmgflags)

{
  AActor *pAVar1;
  
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  pAVar1 = (this->UnmorphedMe).field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((pAVar1->flags).Value & 0x10000000) != 0) {
        pAVar1->health = (this->super_AActor).health;
        (*(pAVar1->super_DThinker).super_DObject._vptr_DObject[0xf])
                  (pAVar1,source,inflictor,(ulong)(uint)dmgflags);
        return;
      }
    }
    else {
      (this->UnmorphedMe).field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void AMorphedMonster::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Dead things don't unmorph
//	flags3 |= MF3_STAYMORPHED;
	// [MH]
	// But they can now, so that line above has been
	// moved into P_MorphedDeath() and is now set by
	// that function if and only if it is needed.
	Super::Die (source, inflictor, dmgflags);
	if (UnmorphedMe != NULL && (UnmorphedMe->flags & MF_UNMORPHED))
	{
		UnmorphedMe->health = health;
		UnmorphedMe->Die (source, inflictor, dmgflags);
	}
}